

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<unsigned_int,_duckdb_fmt::v6::basic_format_specs<char>_>::on_hex
          (int_writer<unsigned_int,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *pbVar3;
  int num_digits;
  string_view prefix;
  hex_writer f;
  
  pbVar3 = this->specs;
  if ((char)pbVar3->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = pbVar3->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = count_digits<4u,unsigned_int>(this->abs_value);
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  f.num_digits = num_digits;
  f.self = this;
  f._12_4_ = 0;
  basic_writer<duckdb_fmt::v6::buffer_range<char>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned_int,duckdb_fmt::v6::basic_format_specs<char>>::hex_writer>
            ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
             *this->specs,f);
  return;
}

Assistant:

void on_hex() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = specs.type;
      }
      int num_digits = count_digits<4>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       hex_writer{*this, num_digits});
    }